

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::ElementsDecodeIssuance::ConvertFromStruct
          (ElementsDecodeIssuance *this,ElementsDecodeIssuanceStruct *data)

{
  ElementsDecodeIssuanceStruct *data_local;
  ElementsDecodeIssuance *this_local;
  
  std::__cxx11::string::operator=((string *)&this->asset_blinding_nonce_,(string *)data);
  std::__cxx11::string::operator=((string *)&this->asset_entropy_,(string *)&data->asset_entropy);
  std::__cxx11::string::operator=((string *)&this->contract_hash_,(string *)&data->contract_hash);
  this->isreissuance_ = (bool)(data->isreissuance & 1);
  std::__cxx11::string::operator=((string *)&this->token_,(string *)&data->token);
  std::__cxx11::string::operator=((string *)&this->asset_,(string *)&data->asset);
  this->assetamount_ = data->assetamount;
  std::__cxx11::string::operator=
            ((string *)&this->assetamountcommitment_,(string *)&data->assetamountcommitment);
  this->tokenamount_ = data->tokenamount;
  std::__cxx11::string::operator=
            ((string *)&this->tokenamountcommitment_,(string *)&data->tokenamountcommitment);
  std::__cxx11::string::operator=
            ((string *)&this->asset_rangeproof_,(string *)&data->asset_rangeproof);
  std::__cxx11::string::operator=
            ((string *)&this->token_rangeproof_,(string *)&data->token_rangeproof);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void ElementsDecodeIssuance::ConvertFromStruct(
    const ElementsDecodeIssuanceStruct& data) {
  asset_blinding_nonce_ = data.asset_blinding_nonce;
  asset_entropy_ = data.asset_entropy;
  contract_hash_ = data.contract_hash;
  isreissuance_ = data.isreissuance;
  token_ = data.token;
  asset_ = data.asset;
  assetamount_ = data.assetamount;
  assetamountcommitment_ = data.assetamountcommitment;
  tokenamount_ = data.tokenamount;
  tokenamountcommitment_ = data.tokenamountcommitment;
  asset_rangeproof_ = data.asset_rangeproof;
  token_rangeproof_ = data.token_rangeproof;
  ignore_items = data.ignore_items;
}